

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_ignoreSectionTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  int local_34;
  int level;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  local_34 = 0;
  pcVar3 = end;
  pcVar2 = ptr;
  do {
    end_local = pcVar2;
    if (end_local == end) {
      return -1;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*end_local)) {
    case 0:
    case 1:
    case 8:
      *nextTokPtr = end_local;
      return 0;
    case 2:
      pcVar2 = end_local + 1;
      if (pcVar2 == end) {
        return -1;
      }
      if (*pcVar2 == '!') {
        pcVar2 = end_local + 2;
        if (pcVar2 == end) {
          return -1;
        }
        if (*pcVar2 == '[') {
          local_34 = local_34 + 1;
          pcVar2 = end_local + 3;
        }
      }
      break;
    default:
      pcVar2 = end_local + 1;
      break;
    case 4:
      pcVar2 = end_local + 1;
      if (pcVar2 == end) {
        return -1;
      }
      if (*pcVar2 == ']') {
        pcVar2 = end_local + 2;
        if (pcVar2 == end) {
          return -1;
        }
        if (*pcVar2 == '>') {
          if (local_34 == 0) {
            *nextTokPtr = end_local + 3;
            return 0x2a;
          }
          local_34 = local_34 + -1;
          pcVar2 = end_local + 3;
        }
      }
      break;
    case 5:
      if ((long)end - (long)end_local < 2) {
        return -2;
      }
      iVar1 = (*enc[3].scanners[2])(enc,end_local,pcVar3,(char **)end_local);
      if (iVar1 != 0) {
        *nextTokPtr = end_local;
        return 0;
      }
      pcVar3 = extraout_RDX;
      pcVar2 = end_local + 2;
      break;
    case 6:
      if ((long)end - (long)end_local < 3) {
        return -2;
      }
      iVar1 = (*enc[3].scanners[3])(enc,end_local,pcVar3,(char **)end_local);
      if (iVar1 != 0) {
        *nextTokPtr = end_local;
        return 0;
      }
      pcVar3 = extraout_RDX_00;
      pcVar2 = end_local + 3;
      break;
    case 7:
      if ((long)end - (long)end_local < 4) {
        return -2;
      }
      iVar1 = (*enc[3].literalScanners[0])(enc,end_local,pcVar3,(char **)end_local);
      if (iVar1 != 0) {
        *nextTokPtr = end_local;
        return 0;
      }
      pcVar3 = extraout_RDX_01;
      pcVar2 = end_local + 4;
    }
  } while( true );
}

Assistant:

static
int PREFIX(ignoreSectionTok)(const ENCODING *enc, const char *ptr, const char *end,
                             const char **nextTokPtr)
{
  int level = 0;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      end = ptr + n;
    }
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_LT:
      if ((ptr += MINBPC(enc)) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_EXCL)) {
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_LSQB)) {
          ++level;
          ptr += MINBPC(enc);
        }
      }
      break;
    case BT_RSQB:
      if ((ptr += MINBPC(enc)) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
          ptr += MINBPC(enc);
          if (level == 0) {
            *nextTokPtr = ptr;
            return XML_TOK_IGNORE_SECT;
          }
          --level;
        }
      }
      break;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}